

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadControlFor
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  pointer pIVar1;
  pointer pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ErrorType *in_RCX;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  allocator local_89;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong local_60;
  ulong local_58;
  string keyword;
  
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  uVar4 = ReadName(text,&keyword);
  iVar8 = 0;
  if (uVar4 == 0) goto LAB_00139e9a;
  bVar3 = std::operator!=(&keyword,"for");
  iVar8 = 0;
  if (bVar3) goto LAB_00139e9a;
  uVar4 = ReadWhitespace(text + 3);
  if (text[(long)(int)uVar4 + 3] != '(') {
    *errorType = SCRPT_ERROR_PARENTHESIS_OPEN;
    iVar8 = -3 - uVar4;
    goto LAB_00139e9a;
  }
  uVar5 = ReadWhitespace(text + (long)(int)uVar4 + 4);
  iVar8 = uVar4 + uVar5 + 4;
  if (text[iVar8] != ';') {
    iVar6 = ReadVariableDefinition(text + iVar8,instrl,errorType);
    if (iVar6 < 1) {
      if (iVar6 < 0) {
LAB_00139e7b:
        iVar8 = iVar6 - iVar8;
        goto LAB_00139e9a;
      }
      iVar6 = ReadExpression((Syntax *)(text + iVar8),(char *)instrl,
                             (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              *)errorType,in_RCX);
      if (0 < iVar6) {
        Instruction::Instruction((Instruction *)&local_80,INSTR_VALUE_POP);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
        Instruction::~Instruction((Instruction *)&local_80);
        goto LAB_00139a21;
      }
      if (iVar6 < 0) goto LAB_00139e7b;
      *errorType = SCRPT_ERROR_FOR_INITIALISATION;
    }
    else {
LAB_00139a21:
      uVar4 = ReadWhitespace(text + (iVar6 + iVar8));
      iVar8 = iVar6 + iVar8 + uVar4;
      if (text[iVar8] == ';') goto LAB_00139a43;
      *errorType = SCRPT_ERROR_SEMICOLON;
    }
    iVar8 = -iVar8;
    goto LAB_00139e9a;
  }
LAB_00139a43:
  uVar4 = ReadWhitespace(text + (long)iVar8 + 1);
  iVar6 = iVar8 + uVar4 + 1;
  pIVar1 = (instrl->
           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pIVar2 = (instrl->
           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  iVar8 = ReadExpression((Syntax *)(text + iVar6),(char *)instrl,
                         (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                          *)errorType,in_RCX);
  if (iVar8 < 1) {
    if (iVar8 == 0) {
      *errorType = SCRPT_ERROR_FOR_CONDITION;
      iVar8 = -iVar6;
    }
    else {
      iVar8 = iVar8 - iVar6;
    }
    goto LAB_00139e9a;
  }
  uVar4 = ReadWhitespace(text + (iVar8 + iVar6));
  iVar8 = iVar8 + iVar6 + uVar4;
  if (text[iVar8] == ';') {
    uVar4 = ReadWhitespace(text + (long)iVar8 + 1);
    local_60 = (long)(instrl->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(instrl->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_start;
    Instruction::Instruction((Instruction *)&local_80,INSTR_JUMP_ELSE);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
    Instruction::~Instruction((Instruction *)&local_80);
    Instruction::Instruction((Instruction *)&local_80,INSTR_JUMP_TO);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
    iVar8 = iVar8 + uVar4 + 1;
    Instruction::~Instruction((Instruction *)&local_80);
    local_88 = CONCAT44(local_88._4_4_,iVar8);
    lVar11 = (long)iVar8;
    iVar8 = ReadExpression((Syntax *)(text + lVar11),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,in_RCX);
    if (iVar8 < 1) {
      if (-1 < iVar8) goto LAB_00139bff;
    }
    else {
      Instruction::Instruction((Instruction *)&local_80,INSTR_VALUE_POP);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
      iVar8 = (int)local_88 + iVar8;
      Instruction::~Instruction((Instruction *)&local_80);
      local_88 = CONCAT44(local_88._4_4_,iVar8);
      lVar11 = (long)iVar8;
LAB_00139bff:
      uVar4 = ReadWhitespace(text + lVar11);
      Instruction::Instruction
                ((Instruction *)&local_80,INSTR_JUMP_TO,
                 (int)((ulong)((long)pIVar1 - (long)pIVar2) >> 4));
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
      Instruction::~Instruction((Instruction *)&local_80);
      Instruction::Instruction
                ((Instruction *)&local_80,INSTR_JUMP_TO,
                 (int)((ulong)((long)(instrl->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(instrl->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      lVar11 = local_60 * 0x10000000;
      Instruction::operator=
                ((Instruction *)
                 (&((instrl->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start)->code +
                 (lVar11 + 0x100000000 >> 0x1c)),(Instruction *)&local_80);
      iVar8 = uVar4 + (int)local_88;
      Instruction::~Instruction((Instruction *)&local_80);
      if (text[iVar8] != ')') {
        *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
        goto LAB_00139e67;
      }
      uVar4 = ReadWhitespace(text + (long)iVar8 + 1);
      iVar8 = uVar4 + iVar8 + 1;
      pIVar1 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pIVar2 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_88 = CONCAT44(local_88._4_4_,iVar8);
      iVar8 = ReadInstruction(text + iVar8,instrl,errorType);
      if (0 < iVar8) {
        uVar4 = (int)(local_60 >> 4) + 2;
        local_60 = (ulong)uVar4;
        Instruction::Instruction((Instruction *)&local_80,INSTR_JUMP_TO,uVar4);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_80);
        Instruction::~Instruction((Instruction *)&local_80);
        Instruction::Instruction
                  ((Instruction *)&local_80,INSTR_JUMP_ELSE,
                   (int)((ulong)((long)(instrl->
                                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(instrl->
                                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4));
        Instruction::operator=
                  ((Instruction *)
                   (&((instrl->
                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_start)->code + (lVar11 >> 0x1c)),
                   (Instruction *)&local_80);
        iVar8 = iVar8 + (int)local_88;
        Instruction::~Instruction((Instruction *)&local_80);
        uVar7 = (long)(instrl->
                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(instrl->
                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_start;
        local_58 = uVar7 >> 4;
        lVar9 = (long)(int)((ulong)((long)pIVar1 - (long)pIVar2) >> 4);
        lVar11 = (long)(uVar7 * 0x10000000 + -0x100000000) >> 0x20;
        lVar10 = lVar9 << 4;
        local_88 = lVar11;
        for (; lVar9 < lVar11; lVar9 = lVar9 + 1) {
          pIVar1 = (instrl->
                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (((&pIVar1->code)[lVar10] == ';') && ((&pIVar1->comp_type)[lVar10] == '\x04')) {
            std::__cxx11::string::string
                      ((string *)&local_80,*(char **)((long)&pIVar1->comp_value + lVar10),&local_89)
            ;
            bVar3 = std::operator==(&local_80,"break");
            std::__cxx11::string::~string((string *)&local_80);
            if (bVar3) {
              Instruction::Instruction((Instruction *)&local_80,INSTR_JUMP_TO,(int)local_58);
              Instruction::operator=
                        ((Instruction *)
                         (&((instrl->
                            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            )._M_impl.super__Vector_impl_data._M_start)->code + lVar10),
                         (Instruction *)&local_80);
              lVar11 = local_88;
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_80,
                         *(char **)((long)&((instrl->
                                            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->comp_value
                                   + lVar10),&local_89);
              bVar3 = std::operator==(&local_80,"continue");
              std::__cxx11::string::~string((string *)&local_80);
              lVar11 = local_88;
              if (!bVar3) goto LAB_00139e53;
              Instruction::Instruction((Instruction *)&local_80,INSTR_JUMP_TO,(int)local_60);
              Instruction::operator=
                        ((Instruction *)
                         (&((instrl->
                            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            )._M_impl.super__Vector_impl_data._M_start)->code + lVar10),
                         (Instruction *)&local_80);
            }
            Instruction::~Instruction((Instruction *)&local_80);
          }
LAB_00139e53:
          lVar10 = lVar10 + 0x10;
        }
        goto LAB_00139e9a;
      }
      if (iVar8 == 0) {
        *errorType = SCRPT_ERROR_INSTRUCTION;
        iVar8 = -(int)local_88;
        goto LAB_00139e9a;
      }
    }
    iVar8 = iVar8 - (int)local_88;
  }
  else {
    *errorType = SCRPT_ERROR_SEMICOLON;
LAB_00139e67:
    iVar8 = -iVar8;
  }
LAB_00139e9a:
  std::__cxx11::string::~string((string *)&keyword);
  return iVar8;
}

Assistant:

int LiteScript::Syntax::ReadControlFor(const char *text, std::vector<Instruction> &instrl,
                                         Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "for")
        return 0;
    int i = 3, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        if ((tmp = ReadVariableDefinition(text + i, instrl, errorType)) > 0)
            i += tmp;
        else if (tmp < 0)
            return tmp - i;
        else if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
            i += tmp;
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
        }
        else if (tmp < 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_INITIALISATION;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ';') {
            errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
            return -i;
        }
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jc = instrl.size();
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_CONDITION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jb = instrl.size();
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
    if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
        i += tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    }
    else if (tmp < 0)
        return tmp - i;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jc));
    instrl[jb + 1] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jex = instrl.size();
    if ((tmp = ReadInstruction(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_INSTRUCTION;
            return -i;
        }
    }
    i += tmp;
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jb + 2));
    instrl[jb] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jex, sz = instrl.size() - 1; it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING) {
            if (std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz + 1);
            else if (std::string(instrl[it].comp_value.v_string) == "continue")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, jb + 2);
        }
    }
    return i;
}